

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

CallRef * __thiscall
wasm::Builder::makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Expression *target,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args,Type type,
          bool isReturn)

{
  CallRef *pCVar1;
  MixedArena *this_00;
  
  this_00 = &this->wasm->allocator;
  pCVar1 = (CallRef *)MixedArena::allocSpace(this_00,0x40,8);
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression._id = CallRefId;
  (pCVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pCVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pCVar1->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pCVar1->operands).allocator = this_00;
  pCVar1->isReturn = false;
  (pCVar1->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id = type.id;
  pCVar1->target = target;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pCVar1->operands,
             args);
  pCVar1->isReturn = isReturn;
  wasm::CallRef::finalize();
  return pCVar1;
}

Assistant:

CallRef* makeCallRef(Expression* target,
                       const T& args,
                       Type type,
                       bool isReturn = false) {
    auto* call = wasm.allocator.alloc<CallRef>();
    call->type = type;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    call->finalize();
    return call;
  }